

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void P_FakeZMovement(AActor *mo)

{
  uint uVar1;
  player_t *ppVar2;
  double dVar3;
  AActor *pAVar4;
  double dVar5;
  double dVar6;
  
  (mo->__Pos).Z = (mo->Vel).Z + (mo->__Pos).Z;
  uVar1 = (mo->flags).Value;
  if (((uVar1 >> 0xe & 1) != 0) && (pAVar4 = (mo->target).field_0.p, pAVar4 != (AActor *)0x0)) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((uVar1 & 0x1200000) == 0) {
        pAVar4 = (mo->target).field_0.p;
        if ((pAVar4 != (AActor *)0x0) &&
           (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (mo->target).field_0.p = (AActor *)0x0;
          pAVar4 = (AActor *)0x0;
        }
        dVar3 = AActor::Distance2D(mo,pAVar4,false);
        pAVar4 = (mo->target).field_0.p;
        dVar5 = (mo->__Pos).Z;
        dVar6 = (pAVar4->Height * 0.5 + (pAVar4->__Pos).Z) - dVar5;
        if ((0.0 <= dVar6) || (dVar6 * -3.0 <= dVar3)) {
          if ((dVar6 <= 0.0) || (dVar6 * 3.0 <= dVar3)) goto LAB_0040c607;
          dVar5 = dVar5 + mo->FloatSpeed;
        }
        else {
          dVar5 = dVar5 - mo->FloatSpeed;
        }
        (mo->__Pos).Z = dVar5;
      }
    }
    else {
      (mo->target).field_0.p = (AActor *)0x0;
    }
  }
LAB_0040c607:
  ppVar2 = mo->player;
  if ((((ppVar2 != (player_t *)0x0) && (((mo->flags).Value & 0x200) != 0)) &&
      (dVar5 = (mo->__Pos).Z, mo->floorz <= dVar5 && dVar5 != mo->floorz)) &&
     ((ppVar2->mo != (APlayerPawn *)mo || ((ppVar2->cheats & 0x40000000) == 0)))) {
    dVar5 = FFastTrig::sin(&fasttrig,
                           (double)level.maptime * 4.5 * 11930464.711111112 + 6755399441055744.0);
    (mo->__Pos).Z = dVar5 + (mo->__Pos).Z;
  }
  if ((mo->__Pos).Z <= mo->floorz) {
    (mo->__Pos).Z = mo->floorz;
  }
  if (mo->ceilingz < (mo->__Pos).Z + mo->Height) {
    (mo->__Pos).Z = mo->ceilingz - mo->Height;
  }
  return;
}

Assistant:

void P_FakeZMovement(AActor *mo)
{
	//
	// adjust height
	//
	mo->AddZ(mo->Vel.Z);
	if ((mo->flags&MF_FLOAT) && mo->target)
	{ // float down towards target if too close
		if (!(mo->flags & MF_SKULLFLY) && !(mo->flags & MF_INFLOAT))
		{
			double dist = mo->Distance2D(mo->target);
			double delta = mo->target->Center() - mo->Z();
			if (delta < 0 && dist < -(delta * 3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta * 3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && mo->flags&MF_NOGRAVITY && (mo->Z() > mo->floorz) && !mo->IsNoClip2())
	{
		mo->AddZ(DAngle(4.5 * level.maptime).Sin());
	}

	//
	// clip movement
	//
	if (mo->Z() <= mo->floorz)
	{ // hit the floor
		mo->SetZ(mo->floorz);
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		mo->SetZ(mo->ceilingz - mo->Height);
	}
}